

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall Args::Arg::process(Arg *this,Context *context)

{
  int iVar1;
  BaseException *this_00;
  CmdLine *in_R8;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  String local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*(this->super_ArgIface)._vptr_ArgIface[6])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this->super_ArgIface)._vptr_ArgIface[4])(this);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_78,"Argument \"",&local_d9);
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_58,this);
      std::operator+(&local_d8,&local_78,&local_58);
      std::operator+(&local_b8,&local_d8,"\" requires value that wasn\'t presented.");
      eatOneValue<Args::CmdLine,Args::Context>
                (&local_98,(Args *)context,(Context *)&local_b8,
                 (String *)(this->super_ArgIface).m_cmdLine,in_R8);
      (*(this->super_ArgIface)._vptr_ArgIface[0x14])(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
    this->m_isDefined = true;
    return;
  }
  this_00 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_b8,"Argument \"",(allocator *)&local_78);
  (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_d8,this);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::operator+(&local_38,&local_98,"\" already defined.");
  BaseException::BaseException(this_00,&local_38);
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Arg::process( Context & context )
{
	if( !isDefined() )
	{
		if( !isWithValue() )
			setDefined( true );
		else
		{
			setValue( eatOneValue( context,
				String( SL( "Argument \"" ) ) +	name() +
					SL( "\" requires value that wasn't presented." ),
				cmdLine() ) );

			setDefined( true );
		}
	}
	else
		throw BaseException( String( SL( "Argument \"" ) ) +
			name() + SL( "\" already defined." ) );
}